

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O0

int xmlconfTestItem(xmlDocPtr doc,xmlNodePtr cur)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *id_00;
  undefined8 uVar4;
  long lVar5;
  xmlChar *local_90;
  int local_7c;
  int i;
  int final;
  int mem;
  int nstest;
  int options;
  xmlChar *edition;
  xmlChar *entities;
  xmlChar *version;
  xmlChar *rec;
  xmlChar *id;
  xmlChar *base;
  xmlChar *uri;
  xmlChar *filename;
  xmlChar *type;
  int ret;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  
  type._4_4_ = -1;
  filename = (xmlChar *)0x0;
  uri = (xmlChar *)0x0;
  base = (xmlChar *)0x0;
  id = (xmlChar *)0x0;
  version = (xmlChar *)0x0;
  entities = (xmlChar *)0x0;
  edition = (xmlChar *)0x0;
  _nstest = 0;
  mem = 0;
  bVar1 = false;
  testErrorsSize = 0;
  testErrors[0] = '\0';
  nbError = 0;
  nbFatal = 0;
  id_00 = (char *)xmlGetProp(cur,"ID");
  if (id_00 == (char *)0x0) {
    uVar4 = xmlGetLineNo(cur);
    test_log("test missing ID, line %ld\n",uVar4);
  }
  else {
    for (local_7c = 0; skipped_tests[local_7c] != (char *)0x0; local_7c = local_7c + 1) {
      iVar2 = strcmp(skipped_tests[local_7c],id_00);
      if (iVar2 == 0) {
        test_log("Skipping test %s from skipped list\n",id_00);
        type._4_4_ = 0;
        nb_skipped = nb_skipped + 1;
        goto LAB_0010201c;
      }
    }
    filename = (xmlChar *)xmlGetProp(cur,"TYPE");
    if (filename == (xmlChar *)0x0) {
      test_log("test %s missing TYPE\n",id_00);
    }
    else {
      base = (xmlChar *)xmlGetProp(cur,"URI");
      if (base == (xmlChar *)0x0) {
        test_log("test %s missing URI\n",id_00);
      }
      else {
        id = (xmlChar *)xmlNodeGetBase(doc,cur);
        uri = composeDir(id,base);
        iVar2 = checkTestFile((char *)uri);
        if (iVar2 == 0) {
          local_90 = uri;
          if (uri == (xmlChar *)0x0) {
            local_90 = "NULL";
          }
          test_log("test %s missing file %s \n",id_00,local_90);
        }
        else {
          entities = (xmlChar *)xmlGetProp(cur,"VERSION");
          edition = (xmlChar *)xmlGetProp(cur,"ENTITIES");
          iVar2 = xmlStrEqual(edition,"none");
          if (iVar2 == 0) {
            mem = 6;
          }
          version = (xmlChar *)xmlGetProp(cur,"RECOMMENDATION");
          if ((((version == (xmlChar *)0x0) || (iVar2 = xmlStrEqual(version,"XML1.0"), iVar2 != 0))
              || (iVar2 = xmlStrEqual(version,"XML1.0-errata2e"), iVar2 != 0)) ||
             ((iVar2 = xmlStrEqual(version,"XML1.0-errata3e"), iVar2 != 0 ||
              (iVar2 = xmlStrEqual(version,"XML1.0-errata4e"), iVar2 != 0)))) {
            if ((entities != (xmlChar *)0x0) && (iVar2 = xmlStrEqual(entities,"1.0"), iVar2 == 0)) {
              test_log("Skipping test %s for %s\n",id_00,entities);
              type._4_4_ = 0;
              nb_skipped = nb_skipped + 1;
              goto LAB_0010201c;
            }
          }
          else {
            iVar2 = xmlStrEqual(version,"NS1.0");
            if ((iVar2 == 0) && (iVar2 = xmlStrEqual(version,"NS1.0-errata1e"), iVar2 == 0)) {
              test_log("Skipping test %s for REC %s\n",id_00,version);
              type._4_4_ = 0;
              nb_skipped = nb_skipped + 1;
              goto LAB_0010201c;
            }
            bVar1 = true;
          }
          type._4_4_ = 1;
          _nstest = xmlGetProp(cur,"EDITION");
          if ((_nstest != 0) && (lVar5 = xmlStrchr(_nstest,0x35), lVar5 == 0)) {
            mem = mem | 0x20000;
          }
          xmlResetLastError();
          testErrorsSize = 0;
          testErrors[0] = '\0';
          iVar2 = xmlMemUsed();
          iVar3 = xmlStrEqual(filename,"not-wf");
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual(filename,"valid");
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(filename,"invalid");
              if (iVar3 == 0) {
                iVar2 = xmlStrEqual(filename,"error");
                if (iVar2 == 0) {
                  test_log("test %s unknown TYPE value %s\n",id_00,filename);
                  type._4_4_ = -1;
                }
                else {
                  test_log("Skipping error test %s \n",id_00);
                  type._4_4_ = 0;
                  nb_skipped = nb_skipped + 1;
                }
                goto LAB_0010201c;
              }
              xmlconfTestInvalid(id_00,(char *)uri,mem | 0x10);
            }
            else {
              xmlconfTestValid(id_00,(char *)uri,mem | 0x10);
            }
          }
          else if (bVar1) {
            xmlconfTestNotNSWF(id_00,(char *)uri,mem);
          }
          else {
            xmlconfTestNotWF(id_00,(char *)uri,mem);
          }
          xmlResetLastError();
          iVar3 = xmlMemUsed();
          if (iVar2 < iVar3) {
            test_log("test %s : %s leaked %d bytes\n",id_00,uri,(ulong)(uint)(iVar3 - iVar2));
            nb_leaks = nb_leaks + 1;
          }
          nb_tests = nb_tests + 1;
        }
      }
    }
  }
LAB_0010201c:
  if (filename != (xmlChar *)0x0) {
    (*_xmlFree)(filename);
  }
  if (edition != (xmlChar *)0x0) {
    (*_xmlFree)(edition);
  }
  if (_nstest != 0) {
    (*_xmlFree)(_nstest);
  }
  if (entities != (xmlChar *)0x0) {
    (*_xmlFree)(entities);
  }
  if (uri != (xmlChar *)0x0) {
    (*_xmlFree)(uri);
  }
  if (base != (xmlChar *)0x0) {
    (*_xmlFree)(base);
  }
  if (id != (xmlChar *)0x0) {
    (*_xmlFree)(id);
  }
  if (id_00 != (char *)0x0) {
    (*_xmlFree)(id_00);
  }
  if (version != (xmlChar *)0x0) {
    (*_xmlFree)(version);
  }
  return type._4_4_;
}

Assistant:

static int
xmlconfTestItem(xmlDocPtr doc, xmlNodePtr cur) {
    int ret = -1;
    xmlChar *type = NULL;
    xmlChar *filename = NULL;
    xmlChar *uri = NULL;
    xmlChar *base = NULL;
    xmlChar *id = NULL;
    xmlChar *rec = NULL;
    xmlChar *version = NULL;
    xmlChar *entities = NULL;
    xmlChar *edition = NULL;
    int options = 0;
    int nstest = 0;
    int mem, final;
    int i;

    testErrorsSize = 0; testErrors[0] = 0;
    nbError = 0;
    nbFatal = 0;
    id = xmlGetProp(cur, BAD_CAST "ID");
    if (id == NULL) {
        test_log("test missing ID, line %ld\n", xmlGetLineNo(cur));
	goto error;
    }
    for (i = 0;skipped_tests[i] != NULL;i++) {
        if (!strcmp(skipped_tests[i], (char *) id)) {
	    test_log("Skipping test %s from skipped list\n", (char *) id);
	    ret = 0;
	    nb_skipped++;
	    goto error;
	}
    }
    type = xmlGetProp(cur, BAD_CAST "TYPE");
    if (type == NULL) {
        test_log("test %s missing TYPE\n", (char *) id);
	goto error;
    }
    uri = xmlGetProp(cur, BAD_CAST "URI");
    if (uri == NULL) {
        test_log("test %s missing URI\n", (char *) id);
	goto error;
    }
    base = xmlNodeGetBase(doc, cur);
    filename = composeDir(base, uri);
    if (!checkTestFile((char *) filename)) {
        test_log("test %s missing file %s \n", id,
	         (filename ? (char *)filename : "NULL"));
	goto error;
    }

    version = xmlGetProp(cur, BAD_CAST "VERSION");

    entities = xmlGetProp(cur, BAD_CAST "ENTITIES");
    if (!xmlStrEqual(entities, BAD_CAST "none")) {
        options |= XML_PARSE_DTDLOAD;
        options |= XML_PARSE_NOENT;
    }
    rec = xmlGetProp(cur, BAD_CAST "RECOMMENDATION");
    if ((rec == NULL) ||
        (xmlStrEqual(rec, BAD_CAST "XML1.0")) ||
	(xmlStrEqual(rec, BAD_CAST "XML1.0-errata2e")) ||
	(xmlStrEqual(rec, BAD_CAST "XML1.0-errata3e")) ||
	(xmlStrEqual(rec, BAD_CAST "XML1.0-errata4e"))) {
	if ((version != NULL) && (!xmlStrEqual(version, BAD_CAST "1.0"))) {
	    test_log("Skipping test %s for %s\n", (char *) id,
	             (char *) version);
	    ret = 0;
	    nb_skipped++;
	    goto error;
	}
	ret = 1;
    } else if ((xmlStrEqual(rec, BAD_CAST "NS1.0")) ||
	       (xmlStrEqual(rec, BAD_CAST "NS1.0-errata1e"))) {
	ret = 1;
	nstest = 1;
    } else {
        test_log("Skipping test %s for REC %s\n", (char *) id, (char *) rec);
	ret = 0;
	nb_skipped++;
	goto error;
    }
    edition = xmlGetProp(cur, BAD_CAST "EDITION");
    if ((edition != NULL) && (xmlStrchr(edition, '5') == NULL)) {
        /* test limited to all versions before 5th */
	options |= XML_PARSE_OLD10;
    }

    /*
     * Reset errors and check memory usage before the test
     */
    xmlResetLastError();
    testErrorsSize = 0; testErrors[0] = 0;
    mem = xmlMemUsed();

    if (xmlStrEqual(type, BAD_CAST "not-wf")) {
        if (nstest == 0)
	    xmlconfTestNotWF((char *) id, (char *) filename, options);
        else
	    xmlconfTestNotNSWF((char *) id, (char *) filename, options);
    } else if (xmlStrEqual(type, BAD_CAST "valid")) {
        options |= XML_PARSE_DTDVALID;
	xmlconfTestValid((char *) id, (char *) filename, options);
    } else if (xmlStrEqual(type, BAD_CAST "invalid")) {
        options |= XML_PARSE_DTDVALID;
	xmlconfTestInvalid((char *) id, (char *) filename, options);
    } else if (xmlStrEqual(type, BAD_CAST "error")) {
        test_log("Skipping error test %s \n", (char *) id);
	ret = 0;
	nb_skipped++;
	goto error;
    } else {
        test_log("test %s unknown TYPE value %s\n", (char *) id, (char *)type);
	ret = -1;
	goto error;
    }

    /*
     * Reset errors and check memory usage after the test
     */
    xmlResetLastError();
    final = xmlMemUsed();
    if (final > mem) {
        test_log("test %s : %s leaked %d bytes\n",
	         id, filename, final - mem);
        nb_leaks++;
    }
    nb_tests++;

error:
    if (type != NULL)
        xmlFree(type);
    if (entities != NULL)
        xmlFree(entities);
    if (edition != NULL)
        xmlFree(edition);
    if (version != NULL)
        xmlFree(version);
    if (filename != NULL)
        xmlFree(filename);
    if (uri != NULL)
        xmlFree(uri);
    if (base != NULL)
        xmlFree(base);
    if (id != NULL)
        xmlFree(id);
    if (rec != NULL)
        xmlFree(rec);
    return(ret);
}